

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O2

Polynom<Rational> __thiscall
Polynom<Rational>::ordinalSub(Polynom<Rational> *this,Polynom<Rational> *a)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  compare_t cVar4;
  ulong uVar5;
  matrix_error *this_00;
  Polynom<Rational> *in_RDX;
  Rational *extraout_RDX;
  Rational *extraout_RDX_00;
  Rational *pRVar6;
  BigInteger *this_01;
  char cVar7;
  Polynom<Rational> PVar8;
  Matrix<Rational> m;
  BigInteger r;
  BigInteger local_f0;
  BigInteger mid;
  BigInteger l;
  Polynom<Rational> res;
  BigInteger local_50;
  
  bVar1 = isOrdinal(a);
  if ((!bVar1) || (bVar1 = isOrdinal(in_RDX), !bVar1)) {
    this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(this_00,"Invalid ordinal");
    __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = degree(a);
  if ((iVar2 < 0) || (iVar3 = degree(in_RDX), iVar2 < iVar3)) {
    Polynom(this);
    pRVar6 = extraout_RDX;
  }
  else {
    Matrix<Rational>::Matrix(&m,1,iVar2 + 1U);
    uVar5 = 0;
    do {
      if (uVar5 == iVar2 + 1U) {
        Polynom(this,&m);
        break;
      }
      BigInteger::BigInteger(&l,0);
      BigInteger::BigInteger(&r,1);
      while( true ) {
        BigInteger::BigInteger(&local_f0,1);
        ::operator-(&mid,&r,&local_f0);
        Rational::Rational((Rational *)&res,&mid);
        Rational::operator=(m.arr + uVar5,(Rational *)&res);
        Rational::~Rational((Rational *)&res);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&mid);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0);
        Polynom(this,&m);
        ordinalAdd(&res,in_RDX);
        cVar4 = ordinalCmp(a,&res);
        Matrix<Rational>::~Matrix((Matrix<Rational> *)&res);
        cVar7 = (cVar4 == CMP_LESS) * '\x05';
        if (cVar4 == CMP_EQUAL) {
          cVar7 = '\x01';
        }
        else {
          Matrix<Rational>::~Matrix(&this->m);
        }
        if (cVar7 != '\0') break;
        BigInteger::BigInteger(&local_50,2);
        BigInteger::operator*=(&r,&local_50);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
      }
      if (cVar7 == '\x05') {
        do {
          BigInteger::BigInteger(&mid,1);
          ::operator+((BigInteger *)&res,&l,&mid);
          bVar1 = operator<((BigInteger *)&res,&r);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&res);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&mid);
          if (!bVar1) {
            Rational::Rational((Rational *)&res,&l);
            Rational::operator=(m.arr + uVar5,(Rational *)&res);
            Rational::~Rational((Rational *)&res);
            bVar1 = true;
            goto LAB_0012ff0a;
          }
          ::operator+((BigInteger *)&res,&l,&r);
          BigInteger::BigInteger(&local_f0,2);
          ::operator/(&mid,(BigInteger *)&res,&local_f0);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&res);
          Rational::Rational((Rational *)&res,&mid);
          Rational::operator=(m.arr + uVar5,(Rational *)&res);
          Rational::~Rational((Rational *)&res);
          Polynom(this,&m);
          ordinalAdd(&res,in_RDX);
          cVar4 = ordinalCmp(a,&res);
          pRVar6 = (Rational *)&res;
          if (cVar4 != CMP_EQUAL) {
            this_01 = &l;
            if (cVar4 == CMP_LESS) {
              this_01 = &r;
            }
            BigInteger::operator=(this_01,&mid);
            Matrix<Rational>::~Matrix((Matrix<Rational> *)&res);
            pRVar6 = (Rational *)this;
          }
          Matrix<Rational>::~Matrix((Matrix<Rational> *)pRVar6);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&mid);
        } while (cVar4 != CMP_EQUAL);
      }
      bVar1 = false;
LAB_0012ff0a:
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&r);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&l);
      uVar5 = uVar5 + 1;
    } while (bVar1);
    Matrix<Rational>::~Matrix(&m);
    pRVar6 = extraout_RDX_00;
  }
  PVar8.m.arr = pRVar6;
  PVar8.m._0_8_ = this;
  return (Polynom<Rational>)PVar8.m;
}

Assistant:

const Polynom<Field> Polynom<Field>::ordinalSub(const Polynom &a) const
{
    if(!isOrdinal() || !a.isOrdinal())
        throw matrix_error("Invalid ordinal");
    int d = degree();
    if(d < 0 || d < a.degree())
        return Polynom();
    Matrix<Field> m(1, d + 1);
    for(int coeff = 0; coeff < d + 1; ++coeff)
    {
        BigInteger l = 0, r = 1;
        for(;; r *= 2)
        {
            m[0][coeff] = r - 1;
            Polynom t(m);
            Polynom res = a.ordinalAdd(t);
            compare_t cmp = ordinalCmp(res);
            if(cmp == CMP_EQUAL)
                return t;
            if(cmp == CMP_LESS)
                break;
        }
        while(l + 1 < r)
        {
            BigInteger mid = (l + r) / 2;
            m[0][coeff] = mid;
            Polynom t(m);
            Polynom res = a.ordinalAdd(t);
            compare_t cmp = ordinalCmp(res);
            if(cmp == CMP_EQUAL)
                return t;
            if(cmp == CMP_LESS)
                r = mid;
            else
                l = mid;
        }
        m[0][coeff] = l;
    }
    return Polynom(m);
}